

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPNQIn.cpp
# Opt level: O2

void __thiscall NaPNQueueInput::put_data(NaPNQueueInput *this,NaReal *pPortion)

{
  NaVector *this_00;
  NaReal NVar1;
  uint uVar2;
  NaReal *pNVar3;
  undefined4 *puVar4;
  ulong uVar5;
  
  if (pPortion != (NaReal *)0x0) {
    this_00 = &this->vQueue;
    uVar2 = NaVector::dim(this_00);
    NaVector::new_dim(this_00,uVar2 + this->nDataSize);
    for (uVar5 = 0; uVar5 < this->nDataSize; uVar5 = uVar5 + 1) {
      NVar1 = pPortion[uVar5];
      uVar2 = NaVector::dim(this_00);
      pNVar3 = NaVector::operator[](this_00,(uVar2 - this->nDataSize) + (int)uVar5);
      *pNVar3 = NVar1;
    }
    return;
  }
  puVar4 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar4 = 0;
  __cxa_throw(puVar4,&NaException::typeinfo,0);
}

Assistant:

void
NaPNQueueInput::put_data (const NaReal* pPortion)
{
  if(NULL == pPortion)
    throw(na_null_pointer);

  unsigned	i;

  vQueue.new_dim(vQueue.dim() + nDataSize);

  for(i = 0; i < nDataSize; ++i){
    vQueue[vQueue.dim() + i - nDataSize] = pPortion[i];
  }
}